

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

int redisvAsyncCommand(redisAsyncContext *ac,redisCallbackFn *fn,void *privdata,char *format,
                      __va_list_tag *ap)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  int iVar2;
  char *in_RAX;
  char *cmd;
  char *local_38;
  
  __mutex = &ac->ctxlock;
  local_38 = in_RAX;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar1 = redisvFormatCommand(&local_38,format,ap);
  if ((int)uVar1 < 0) {
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    iVar2 = -1;
  }
  else {
    iVar2 = __redisAsyncCommand(ac,fn,privdata,local_38,(ulong)uVar1);
    free(local_38);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return iVar2;
}

Assistant:

int redisvAsyncCommand(redisAsyncContext *ac, redisCallbackFn *fn, void *privdata, const char *format, va_list ap) {
    pthread_mutex_lock(&ac->ctxlock);
    char *cmd;
    int len;
    int status;
    len = redisvFormatCommand(&cmd,format,ap);

    /* We don't want to pass -1 or -2 to future functions as a length. */
    if (len < 0) {
        pthread_mutex_lock(&ac->ctxlock);
        return REDIS_ERR;
    }

    status = __redisAsyncCommand(ac,fn,privdata,cmd,len);
    free(cmd);
    pthread_mutex_unlock(&ac->ctxlock);
    return status;
}